

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_api_base.h
# Opt level: O2

void __thiscall
mp::VarArrayDef::VarArrayDef
          (VarArrayDef *this,initializer_list<double> lbs,initializer_list<double> ubs,
          initializer_list<mp::var::Type> tys,initializer_list<const_char_*> nms)

{
  allocator_type local_41;
  _Vector_base<const_char_*,_std::allocator<const_char_*>_> local_40;
  
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_40,lbs,&local_41);
  ArrayRef<double>::ArrayRef(&this->lbs_,(vector<double,_std::allocator<double>_> *)&local_40);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&local_40);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_40,ubs,&local_41);
  ArrayRef<double>::ArrayRef(&this->ubs_,(vector<double,_std::allocator<double>_> *)&local_40);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&local_40);
  std::vector<mp::var::Type,_std::allocator<mp::var::Type>_>::vector
            ((vector<mp::var::Type,_std::allocator<mp::var::Type>_> *)&local_40,tys,
             (allocator_type *)&local_41);
  ArrayRef<mp::var::Type>::ArrayRef
            (&this->types_,(vector<mp::var::Type,_std::allocator<mp::var::Type>_> *)&local_40);
  std::_Vector_base<mp::var::Type,_std::allocator<mp::var::Type>_>::~_Vector_base
            ((_Vector_base<mp::var::Type,_std::allocator<mp::var::Type>_> *)&local_40);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)&local_40,nms,
             (allocator_type *)&local_41);
  ArrayRef<const_char_*>::ArrayRef
            (&this->names_,(vector<const_char_*,_std::allocator<const_char_*>_> *)&local_40);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base(&local_40);
  return;
}

Assistant:

VarArrayDef(std::initializer_list<double> lbs,
              std::initializer_list<double> ubs,
              std::initializer_list<var::Type> tys,
              std::initializer_list<const char*> nms = {}) :
    lbs_((lbs)), ubs_((ubs)), types_((tys)), names_(nms) { }